

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

bool __thiscall ZAP::Archive::loadStream(Archive *this)

{
  bool bVar1;
  int in_ESI;
  Archive *this_local;
  
  bVar1 = parseHeader(this);
  if (bVar1) {
    buildLookupTable(this);
  }
  else {
    close(this,in_ESI);
  }
  return bVar1;
}

Assistant:

bool Archive::loadStream()
	{
		if (!parseHeader())
		{
			close();
			return false;
		}
		else
		{
			buildLookupTable();
			return true;
		}
	}